

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O0

void __thiscall
RGBColorSpace_StdIllumWhiteACES2065_1_Test::~RGBColorSpace_StdIllumWhiteACES2065_1_Test
          (RGBColorSpace_StdIllumWhiteACES2065_1_Test *this)

{
  void *in_RDI;
  
  ~RGBColorSpace_StdIllumWhiteACES2065_1_Test
            ((RGBColorSpace_StdIllumWhiteACES2065_1_Test *)0x5a04e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(RGBColorSpace, StdIllumWhiteACES2065_1) {
    XYZ xyz = SpectrumToXYZ(&RGBColorSpace::ACES2065_1->illuminant);
    RGB rgb = RGBColorSpace::ACES2065_1->ToRGB(xyz);
    EXPECT_GE(rgb.r, .99);
    EXPECT_LE(rgb.r, 1.01);
    EXPECT_GE(rgb.g, .99);
    EXPECT_LE(rgb.g, 1.01);
    EXPECT_GE(rgb.b, .99);
    EXPECT_LE(rgb.b, 1.01);
}